

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O2

void __thiscall
hgdb::rtl::ExpressionPrinter::handle(ExpressionPrinter *this,RangeSelectExpression *param_1)

{
  NotSupportedException *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (NotSupportedException *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"RangeSelectExpression not supported for hgdb expression",&local_39
            );
  NotSupportedException::NotSupportedException(this_00,&local_38,*this->loc_);
  __cxa_throw(this_00,&NotSupportedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void handle(const slang::ast::RangeSelectExpression &) {
        throw NotSupportedException("RangeSelectExpression not supported for hgdb expression",
                                    loc_);
    }